

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_visitor.cc
# Opt level: O3

void __thiscall iqxmlrpc::Print_value_visitor::do_visit_array(Print_value_visitor *this,Array *a)

{
  pointer ppVVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(this->out_,"[",1);
  ppVVar1 = (a->values).super__Vector_base<iqxmlrpc::Value_*,_std::allocator<iqxmlrpc::Value_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppVVar1 !=
      (a->values).super__Vector_base<iqxmlrpc::Value_*,_std::allocator<iqxmlrpc::Value_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(this->out_," ",1);
      Value::apply_visitor(*ppVVar1,&this->super_Value_type_visitor);
      std::__ostream_insert<char,std::char_traits<char>>(this->out_,",",1);
      ppVVar1 = ppVVar1 + 1;
    } while (ppVVar1 !=
             (a->values).super__Vector_base<iqxmlrpc::Value_*,_std::allocator<iqxmlrpc::Value_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>(this->out_," ]",2);
  return;
}

Assistant:

void Print_value_visitor::do_visit_array(const Array& a)
{
  out_ << "[";

  typedef Array::const_iterator CI;
  for(CI i = a.begin(); i != a.end(); ++i )
  {
    out_ << " ";
    i->apply_visitor(*this);
    out_ << ",";
  }

  out_ << " ]";
}